

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void forbody(LexState *ls,int base,int line,int nvars,int isnum,Fornuminfo *info)

{
  FuncState *fs;
  int list;
  int list_00;
  OpCode o;
  OpCode local_50;
  BlockCnt bl;
  
  fs = ls->fs;
  adjustlocalvars(ls,3);
  checknext(ls,0x103);
  if (isnum == 0) {
    list = luaK_jump(fs);
    local_50 = OP_FORLOOP;
  }
  else {
    (ls->fs->f->ravi_jit).jit_flags = '\x01';
    o = OP_FORPREP;
    local_50 = OP_FORLOOP;
    if ((info != (Fornuminfo *)0x0) && (info->is_constant != 0)) {
      if (info->int_value < 2) {
        if (info->int_value == 1) {
          o = OP_RAVI_FORPREP_I1;
          local_50 = OP_RAVI_FORLOOP_I1;
        }
      }
      else {
        o = OP_RAVI_FORPREP_IP;
        local_50 = OP_RAVI_FORLOOP_IP;
      }
    }
    list = luaK_codeABx(fs,o,base,0x7fff);
  }
  enterblock(fs,&bl,'\0');
  adjustlocalvars(ls,nvars);
  luaK_reserveregs(fs,nvars);
  block(ls);
  leaveblock(fs);
  luaK_patchtohere(fs,list);
  if (isnum == 0) {
    luaK_codeABC(fs,OP_TFORCALL,base,0,nvars);
    luaK_fixline(fs,line);
    list_00 = luaK_codeABx(fs,OP_TFORLOOP,base + 2,0x7fff);
  }
  else {
    list_00 = luaK_codeABx(fs,local_50,base,0x7fff);
  }
  luaK_patchlist(fs,list_00,list + 1);
  luaK_fixline(fs,line);
  return;
}

Assistant:

static void forbody (LexState *ls, int base, int line, int nvars, int isnum, Fornuminfo *info) {
  /* forbody -> DO block */
  BlockCnt bl;
  OpCode forprep_inst = OP_FORPREP, forloop_inst = OP_FORLOOP;
  FuncState *fs = ls->fs;
  int prep, endfor;
  adjustlocalvars(ls, 3);  /* control variables */
  checknext(ls, TK_DO);
  if (isnum) {
    ls->fs->f->ravi_jit.jit_flags = RAVI_JIT_FLAG_HASFORLOOP;
    if (info && info->is_constant && info->int_value > 1) {
      forprep_inst = OP_RAVI_FORPREP_IP;
      forloop_inst = OP_RAVI_FORLOOP_IP;
    }
    else if (info && info->is_constant && info->int_value == 1) {
      forprep_inst = OP_RAVI_FORPREP_I1;
      forloop_inst = OP_RAVI_FORLOOP_I1;
    }
  }
  prep = isnum ? luaK_codeAsBx(fs, forprep_inst, base, NO_JUMP) : luaK_jump(fs);
  enterblock(fs, &bl, 0);  /* scope for declared variables */
  adjustlocalvars(ls, nvars);
  luaK_reserveregs(fs, nvars);
  block(ls);
  leaveblock(fs);  /* end of scope for declared variables */
  luaK_patchtohere(fs, prep);
  if (isnum)  /* numeric for? */
    endfor = luaK_codeAsBx(fs, forloop_inst, base, NO_JUMP);
  else {  /* generic for */
    luaK_codeABC(fs, OP_TFORCALL, base, 0, nvars);
    luaK_fixline(fs, line);
    endfor = luaK_codeAsBx(fs, OP_TFORLOOP, base + 2, NO_JUMP);
  }
  luaK_patchlist(fs, endfor, prep + 1);
  luaK_fixline(fs, line);
}